

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utVertexTriangleAdjacency.cpp
# Opt level: O2

void __thiscall
VTAdjacencyTest_largeRandomDataSet_Test::~VTAdjacencyTest_largeRandomDataSet_Test
          (VTAdjacencyTest_largeRandomDataSet_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(VTAdjacencyTest, largeRandomDataSet)
{
    // build a test mesh with randomized input data
    // *******************************************************************************
    aiMesh mesh;

    mesh.mNumVertices = 500;
    mesh.mNumFaces = 600;

    mesh.mFaces = new aiFace[600];
    unsigned int iCurrent = 0;
    for (unsigned int i = 0; i < 600;++i)
    {
        aiFace& face = mesh.mFaces[i];
        face.mNumIndices = 3;
        face.mIndices = new unsigned int[3];

        if (499 == iCurrent)iCurrent = 0;
        face.mIndices[0] = iCurrent++;


        while(face.mIndices[0] == ( face.mIndices[1] = (unsigned int)(((float)rand()/RAND_MAX)*499)));
        while(face.mIndices[0] == ( face.mIndices[2] = (unsigned int)(((float)rand()/RAND_MAX)*499)) ||
            face.mIndices[1] == face.mIndices[2]);
    }

    checkMesh(mesh);
}